

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemoryRegion_conflict *
address_space_translate_cached
          (MemoryRegionCache *cache,hwaddr addr,hwaddr *xlat,hwaddr *plen,_Bool is_write,
          MemTxAttrs attrs)

{
  IOMMUMemoryRegion *iommu_mr;
  AddressSpace *target_as;
  AddressSpace **in_stack_ffffffffffffffb0;
  MemTxAttrs in_stack_ffffffffffffffb8;
  IOMMUMemoryRegion *local_38;
  
  if (cache->ptr == (void *)0x0) {
    *xlat = addr + cache->xlat;
    iommu_mr = (IOMMUMemoryRegion *)(cache->mrs).mr;
    if ((iommu_mr != (IOMMUMemoryRegion *)0x0) && ((iommu_mr->parent_obj).is_iommu != false)) {
      address_space_translate_iommu
                ((MemoryRegionSection *)&stack0xffffffffffffffb8,iommu_mr,xlat,plen,
                 (hwaddr *)(ulong)is_write,SUB81(&stack0xffffffffffffffb0,0),attrs._0_1_,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
      iommu_mr = local_38;
    }
    return (MemoryRegion_conflict *)iommu_mr;
  }
  __assert_fail("!cache->ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x7b1,
                "MemoryRegion *address_space_translate_cached(MemoryRegionCache *, hwaddr, hwaddr *, hwaddr *, _Bool, MemTxAttrs)"
               );
}

Assistant:

static inline MemoryRegion *address_space_translate_cached(
    MemoryRegionCache *cache, hwaddr addr, hwaddr *xlat,
    hwaddr *plen, bool is_write, MemTxAttrs attrs)
{
    MemoryRegionSection section;
    MemoryRegion *mr;
    IOMMUMemoryRegion *iommu_mr;
    AddressSpace *target_as;

    assert(!cache->ptr);
    *xlat = addr + cache->xlat;

    mr = cache->mrs.mr;
    iommu_mr = memory_region_get_iommu(mr);
    if (!iommu_mr) {
        /* MMIO region.  */
        return mr;
    }

    section = address_space_translate_iommu(iommu_mr, xlat, plen,
                                            NULL, is_write, true,
                                            &target_as, attrs);
    return section.mr;
}